

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

QSize __thiscall QToolBarAreaLayout::sizeHint(QToolBarAreaLayout *this,QSize *centerHint)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  QSize *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QSize bottom_hint;
  QSize top_hint;
  QSize right_hint;
  QSize left_hint;
  QSize result;
  int in_stack_ffffffffffffff7c;
  QSize *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  QSize local_30;
  QSize local_28;
  QSize local_20;
  QSize local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 0xf8) & 1) == 0) {
    local_10 = *in_RSI;
  }
  else {
    local_10 = *in_RSI;
    local_18 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = QToolBarAreaLayoutInfo::sizeHint
                         ((QToolBarAreaLayoutInfo *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    local_20 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_20 = QToolBarAreaLayoutInfo::sizeHint
                         ((QToolBarAreaLayoutInfo *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    local_28 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QToolBarAreaLayoutInfo::sizeHint
                         ((QToolBarAreaLayoutInfo *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    local_30 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_30 = QToolBarAreaLayoutInfo::sizeHint
                         ((QToolBarAreaLayoutInfo *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    local_34 = QSize::width((QSize *)0x6f2dd9);
    local_38 = QSize::width((QSize *)0x6f2de7);
    qMax<int>(&local_34,&local_38);
    QSize::setWidth(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    local_3c = QSize::width((QSize *)0x6f2e10);
    local_40 = QSize::width((QSize *)0x6f2e1e);
    qMax<int>(&local_3c,&local_40);
    QSize::setWidth(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    local_44 = QSize::height((QSize *)0x6f2e47);
    local_48 = QSize::height((QSize *)0x6f2e55);
    qMax<int>(&local_44,&local_48);
    QSize::setHeight(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    QSize::height((QSize *)0x6f2e7e);
    QSize::height((QSize *)0x6f2e8c);
    qMax<int>((int *)&stack0xffffffffffffffb4,(int *)&stack0xffffffffffffffb0);
    QSize::setHeight(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    iVar1 = QSize::width((QSize *)0x6f2eb5);
    iVar2 = QSize::width((QSize *)0x6f2ec3);
    piVar3 = QSize::rwidth((QSize *)0x6f2ed9);
    *piVar3 = iVar1 + iVar2 + *piVar3;
    iVar1 = QSize::height((QSize *)0x6f2eeb);
    iVar2 = QSize::height((QSize *)0x6f2ef9);
    piVar3 = QSize::rheight((QSize *)0x6f2f0f);
    *piVar3 = iVar1 + iVar2 + *piVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QToolBarAreaLayout::sizeHint(const QSize &centerHint) const
{
    if (!visible)
        return centerHint;

    QSize result = centerHint;

    QSize left_hint = docks[QInternal::LeftDock].sizeHint();
    QSize right_hint = docks[QInternal::RightDock].sizeHint();
    QSize top_hint = docks[QInternal::TopDock].sizeHint();
    QSize bottom_hint = docks[QInternal::BottomDock].sizeHint();

    result.setWidth(qMax(top_hint.width(), result.width()));
    result.setWidth(qMax(bottom_hint.width(), result.width()));
    result.setHeight(qMax(left_hint.height(), result.height()));
    result.setHeight(qMax(right_hint.height(), result.height()));

    result.rwidth() += left_hint.width() + right_hint.width();
    result.rheight() += top_hint.height() + bottom_hint.height();

    return result;
}